

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor.cpp
# Opt level: O2

pair<slang::parsing::Trivia,_slang::parsing::Trivia> * __thiscall
slang::parsing::Preprocessor::handlePragmaDirective
          (pair<slang::parsing::Trivia,_slang::parsing::Trivia> *__return_storage_ptr__,
          Preprocessor *this,Token directive)

{
  BumpAllocator *this_00;
  pair<slang::parsing::Trivia,_slang::parsing::Trivia> *ppVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  SourceLocation SVar5;
  undefined4 extraout_var;
  PragmaDirectiveSyntax *pragma;
  undefined4 extraout_var_00;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *pEVar6;
  undefined8 extraout_RDX_01;
  EVP_PKEY_CTX *src;
  __extent_storage<18446744073709551615UL> extraout_RDX_02;
  Token TVar7;
  pair<slang::syntax::PragmaExpressionSyntax_*,_bool> pVar8;
  string_view sVar9;
  Trivia TVar10;
  span<const_slang::parsing::Token,_18446744073709551615UL> tokens;
  Trivia skippedTrivia;
  undefined1 local_138 [14];
  undefined2 uStack_12a;
  pair<slang::parsing::Trivia,_slang::parsing::Trivia> *local_128;
  Token directive_local;
  Token name;
  SmallVector<slang::parsing::Token,_4UL> skipped;
  SmallVector<slang::syntax::TokenOrSyntax,_4UL> args;
  
  directive_local.info = directive.info;
  directive_local._0_8_ = directive._0_8_;
  TVar7 = peek(this);
  if (TVar7.kind == Identifier) {
    args.super_SmallVectorBase<slang::syntax::TokenOrSyntax>._0_16_ = peek(this);
    bVar2 = Token::isOnSameLine((Token *)&args);
    if (bVar2) {
      args.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.len = 0;
      args.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.data_ =
           (pointer)args.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement;
      args.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.cap = 4;
      skipped.super_SmallVectorBase<slang::parsing::Token>.data_ =
           (pointer)skipped.super_SmallVectorBase<slang::parsing::Token>.firstElement;
      skipped.super_SmallVectorBase<slang::parsing::Token>.len = 0;
      skipped.super_SmallVectorBase<slang::parsing::Token>.cap = 4;
      local_128 = __return_storage_ptr__;
      name = consume(this);
      bVar2 = false;
      do {
        bVar3 = peekSameLine(this);
        pEVar6 = extraout_RDX;
        if (!bVar3) goto LAB_0025f1e9;
        if (bVar2) {
          skippedTrivia = (Trivia)expect(this,Comma);
          SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                    (&args.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
                     (TokenOrSyntax *)&skippedTrivia);
        }
        else {
          pVar8 = parsePragmaExpression(this);
          skippedTrivia.field_0.rawText.ptr = (char *)pVar8.first;
          SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                    (&args.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
                     (TokenOrSyntax *)&skippedTrivia);
          if (((undefined1  [16])pVar8 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            while (bVar2 = peekSameLine(this), pEVar6 = extraout_RDX_00, bVar2) {
              skippedTrivia = (Trivia)consume(this);
              SmallVectorBase<slang::parsing::Token>::emplace_back<slang::parsing::Token>
                        (&skipped.super_SmallVectorBase<slang::parsing::Token>,
                         (Token *)&skippedTrivia);
            }
LAB_0025f1e9:
            this_00 = this->alloc;
            skippedTrivia.field_0._0_4_ =
                 SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                           (&args.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
                            (EVP_PKEY_CTX *)this_00,pEVar6);
            skippedTrivia.field_0._4_4_ = extraout_var;
            skippedTrivia._8_8_ = extraout_RDX_01;
            pragma = BumpAllocator::
                     emplace<slang::syntax::PragmaDirectiveSyntax,slang::parsing::Token&,slang::parsing::Token&,std::span<slang::syntax::TokenOrSyntax,18446744073709551615ul>>
                               (this_00,&directive_local,&name,
                                (span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> *)
                                &skippedTrivia);
            ppVar1 = local_128;
            if (!bVar3) {
              applyPragma(this,pragma,&skipped.super_SmallVectorBase<slang::parsing::Token>);
            }
            Trivia::Trivia(&skippedTrivia);
            if (skipped.super_SmallVectorBase<slang::parsing::Token>.len != 0) {
              iVar4 = SmallVectorBase<slang::parsing::Token>::copy
                                (&skipped.super_SmallVectorBase<slang::parsing::Token>,
                                 (EVP_PKEY_CTX *)this->alloc,src);
              tokens._M_ptr._4_4_ = extraout_var_00;
              tokens._M_ptr._0_4_ = iVar4;
              tokens._M_extent._M_extent_value = extraout_RDX_02._M_extent_value;
              Trivia::Trivia((Trivia *)local_138,SkippedTokens,tokens);
              TVar10 = skippedTrivia;
              skippedTrivia.field_0._6_2_ = local_138._6_2_;
              skippedTrivia.field_0._0_6_ = local_138._0_6_;
              skippedTrivia._14_2_ = TVar10._14_2_;
              skippedTrivia._8_8_ =
                   SUB108(CONCAT28(skippedTrivia._14_2_,CONCAT62(local_138._8_6_,local_138._6_2_))
                          >> 0x10,0);
            }
            pEVar6 = (EVP_PKEY_CTX *)0x8;
            Trivia::Trivia((Trivia *)local_138,Directive,(SyntaxNode *)pragma);
            (ppVar1->first).field_0.rawText.ptr = (char *)CONCAT26(local_138._6_2_,local_138._0_6_);
            *(ulong *)((long)&(ppVar1->first).field_0 + 8) = CONCAT26(uStack_12a,local_138._8_6_);
            (ppVar1->second).field_0.rawText.ptr = skippedTrivia.field_0.rawText.ptr;
            *(undefined8 *)((long)&(ppVar1->second).field_0 + 8) = skippedTrivia._8_8_;
            SmallVectorBase<slang::parsing::Token>::cleanup
                      (&skipped.super_SmallVectorBase<slang::parsing::Token>,pEVar6);
            SmallVectorBase<slang::syntax::TokenOrSyntax>::cleanup
                      (&args.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,pEVar6);
            return ppVar1;
          }
        }
        bVar2 = (bool)(bVar2 ^ 1);
      } while( true );
    }
  }
  SVar5 = Token::location(&directive_local);
  sVar9 = Token::rawText(&directive_local);
  addDiag(this,(DiagCode)0x90004,(SourceLocation)((long)SVar5 + sVar9._M_len * 0x10000000));
  TVar7.info = directive_local.info;
  TVar7.kind = directive_local.kind;
  TVar7._2_1_ = directive_local._2_1_;
  TVar7.numFlags.raw = directive_local.numFlags.raw;
  TVar7.rawLen = directive_local.rawLen;
  TVar10 = createSimpleDirective(this,TVar7);
  Trivia::Trivia(&__return_storage_ptr__->second);
  (__return_storage_ptr__->first).field_0.rawText.ptr = TVar10.field_0._0_8_;
  (__return_storage_ptr__->first).hasFullLocation = (bool)(char)TVar10._12_2_;
  (__return_storage_ptr__->first).kind = (char)((ushort)TVar10._12_2_ >> 8);
  (__return_storage_ptr__->first).field_0.rawText.len = TVar10.field_0._8_4_;
  return __return_storage_ptr__;
}

Assistant:

std::pair<Trivia, Trivia> Preprocessor::handlePragmaDirective(Token directive) {
    if (peek().kind != TokenKind::Identifier || !peek().isOnSameLine()) {
        addDiag(diag::ExpectedPragmaName, directive.location() + directive.rawText().length());
        return {createSimpleDirective(directive), Trivia()};
    }

    SmallVector<TokenOrSyntax, 4> args;
    SmallVector<Token, 4> skipped;
    Token name = consume();
    bool wantComma = false;
    bool ok = true;

    // This loop needs to be careful not to prematurely peek() and pull a
    // new token from the lexer, since some pragmas may change how we lex
    // tokens on the following line (such as pragma protect encoded blocks).
    while (peekSameLine()) {
        if (wantComma) {
            args.push_back(expect(TokenKind::Comma));
            wantComma = false;
        }
        else {
            auto [expr, succeeded] = parsePragmaExpression();
            args.push_back(expr);
            wantComma = true;

            if (!succeeded) {
                while (peekSameLine())
                    skipped.push_back(consume());

                ok = false;
                break;
            }
        }
    }

    auto result = alloc.emplace<PragmaDirectiveSyntax>(directive, name, args.copy(alloc));
    if (ok)
        applyPragma(*result, skipped);

    Trivia skippedTrivia;
    if (!skipped.empty())
        skippedTrivia = Trivia(TriviaKind::SkippedTokens, skipped.copy(alloc));

    return {Trivia(TriviaKind::Directive, result), skippedTrivia};
}